

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::detail::
union_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::append_selector(union_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *this,selector_type *tail)

{
  selector_type *psVar1;
  pointer ppjVar2;
  undefined8 in_RDX;
  jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  **selector;
  pointer ppjVar3;
  
  psVar1 = this->tail_;
  if (psVar1 != (selector_type *)0x0) {
    (*psVar1->_vptr_jsonpath_selector[4])(psVar1,tail,in_RDX,psVar1->_vptr_jsonpath_selector[4]);
    return;
  }
  this->tail_ = tail;
  ppjVar2 = (this->selectors_).
            super__Vector_base<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppjVar3 = (this->selectors_).
                 super__Vector_base<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::allocator<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppjVar3 != ppjVar2;
      ppjVar3 = ppjVar3 + 1) {
    (*(*ppjVar3)->_vptr_jsonpath_selector[4])(*ppjVar3,tail);
  }
  return;
}

Assistant:

void append_selector(selector_type* tail) override
        {
            if (tail_ == nullptr)
            {
                tail_ = tail;
                for (auto& selector : selectors_)
                {
                    selector->append_selector(tail);
                }
            }
            else
            {
                tail_->append_selector(tail);
            }
        }